

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::DragBehaviorT<long_long,long_long,double>
               (ImGuiDataType data_type,longlong *v,float v_speed,longlong v_min,longlong v_max,
               char *format,ImGuiSliderFlags flags)

{
  long lVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  undefined1 *v_00;
  uint uVar8;
  byte bVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  ImVec2 local_38;
  
  pIVar2 = GImGui;
  uVar4 = data_type & 0xfffffffe;
  v_00 = (undefined1 *)(v_max & 0xffffffffffffff00);
  if (v_speed == 0.0 && (v_max - v_min != 0 && v_min <= v_max)) {
    v_speed = (float)(v_max - v_min) * GImGui->DragSpeedDefaultRatio;
  }
  uVar8 = (flags & 0x100000U) >> 0x14;
  if (((GImGui->ActiveIdSource != ImGuiInputSource_Mouse) ||
      (bVar3 = IsMousePosValid((ImVec2 *)0x0), !bVar3)) ||
     ((pIVar2->IO).MouseDragMaxDistanceSqr[0] <= 1.0)) {
    fVar12 = 0.0;
    if (pIVar2->ActiveIdSource == ImGuiInputSource_Nav) {
      uVar5 = 0;
      if (uVar4 == 8) {
        uVar5 = ImParseFormatPrecision(format,3);
      }
      local_38 = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      fVar12 = (&local_38.x)[uVar8];
      if ((int)uVar5 < 0) {
        fVar11 = 1.1754944e-38;
      }
      else if ((int)uVar5 < 10) {
        v_00 = GetMinimumStepAtDecimalPrecision(int)::min_steps;
        fVar11 = *(float *)(GetMinimumStepAtDecimalPrecision(int)::min_steps + (ulong)uVar5 * 4);
      }
      else {
        fVar11 = powf(10.0,(float)(int)-uVar5);
      }
      v_speed = (float)((uint)v_speed & -(uint)(fVar11 <= v_speed) |
                       ~-(uint)(fVar11 <= v_speed) & (uint)fVar11);
    }
  }
  else {
    fVar12 = (pIVar2->IO).NavInputs[(ulong)uVar8 + 0x1d];
    if ((pIVar2->IO).KeyAlt != false) {
      fVar12 = fVar12 * 0.01;
    }
    if ((pIVar2->IO).KeyShift == true) {
      fVar12 = fVar12 * 10.0;
    }
  }
  bVar9 = uVar4 == 8 & (byte)((flags & 0x20U) >> 5);
  fVar12 = fVar12 * v_speed;
  if ((flags & 0x100000U) != 0) {
    fVar12 = -fVar12;
  }
  if ((bVar9 != 0) && (v_max - v_min != 0 && v_min <= v_max)) {
    fVar12 = fVar12 / (float)(v_max - v_min);
  }
  if (v_min < v_max) {
    if ((*v < v_max) || (v_00 = (undefined1 *)CONCAT71((int7)((ulong)v_00 >> 8),1), fVar12 <= 0.0))
    {
      v_00 = (undefined1 *)CONCAT71((int7)((ulong)v_00 >> 8),fVar12 < 0.0 && *v <= v_min);
    }
  }
  else {
    v_00 = (undefined1 *)0x0;
  }
  if ((pIVar2->ActiveIdIsJustActivated == false) && ((char)v_00 == '\0')) {
    if ((fVar12 == 0.0) && (!NAN(fVar12))) goto LAB_001751c9;
    pIVar2->DragCurrentAccum = pIVar2->DragCurrentAccum + fVar12;
    bVar3 = true;
  }
  else {
    pIVar2->DragCurrentAccum = 0.0;
    bVar3 = false;
  }
  pIVar2->DragCurrentAccumDirty = bVar3;
LAB_001751c9:
  if (pIVar2->DragCurrentAccumDirty == true) {
    lVar7 = *v;
    if (bVar9 == 0) {
      lVar7 = lVar7 + (long)pIVar2->DragCurrentAccum;
      fVar10 = 0.0;
      fVar11 = 0.0;
    }
    else {
      iVar6 = ImParseFormatPrecision(format,3);
      fVar10 = powf(0.1,(float)iVar6);
      fVar11 = ScaleRatioFromValueT<long_long,long_long,double>
                         (data_type,lVar7,v_min,v_max,true,fVar10,0.0);
      v_00 = (undefined1 *)0x1;
      lVar7 = ScaleValueFromRatioT<long_long,long_long,double>
                        (data_type,pIVar2->DragCurrentAccum + fVar11,v_min,v_max,true,fVar10,0.0);
    }
    if ((flags & 0x40U) == 0) {
      lVar7 = RoundScalarWithFormatT<long_long,long_long>
                        ((ImGui *)format,(char *)(ulong)(uint)data_type,(ImGuiDataType)lVar7,
                         (longlong)v_00);
    }
    pIVar2->DragCurrentAccumDirty = false;
    if (bVar9 == 0) {
      fVar10 = (float)(lVar7 - *v);
    }
    else {
      fVar10 = ScaleRatioFromValueT<long_long,long_long,double>
                         (data_type,lVar7,v_min,v_max,true,fVar10,0.0);
      fVar10 = fVar10 - fVar11;
    }
    pIVar2->DragCurrentAccum = pIVar2->DragCurrentAccum - fVar10;
    lVar1 = *v;
    if ((v_min < v_max) && (lVar1 != lVar7)) {
      if ((lVar7 < v_min) || (((uVar4 != 8 && (lVar1 < lVar7)) && (fVar12 < 0.0)))) {
        lVar7 = v_min;
      }
      if ((v_max < lVar7) || (((uVar4 != 8 && (lVar7 < lVar1)) && (0.0 < fVar12)))) {
        lVar7 = v_max;
      }
    }
    bVar3 = lVar1 != lVar7;
    if (bVar3) {
      *v = lVar7;
      bVar3 = true;
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_clamped = (v_min < v_max);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) && is_decimal;

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && g.IO.MouseDragMaxDistanceSqr[0] > 1.0f * 1.0f)
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // For logarithmic use our range is effectively 0..1 so scale the delta into that range
    if (is_logarithmic && (v_max - v_min < FLT_MAX) && ((v_max - v_min) > 0.000001f)) // Epsilon to avoid /0
        adjust_delta /= (float)(v_max - v_min);

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    if (is_just_activated || is_already_past_limits_and_pushing_outward)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    const float zero_deadzone_halfsize = 0.0f; // Drag widgets have no deadzone (as it doesn't make sense)
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);

        // Convert to parametric space, apply delta, convert back
        float v_old_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        float v_new_parametric = v_old_parametric + g.DragCurrentAccum;
        v_cur = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new_parametric, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        v_old_ref_for_accum_remainder = v_old_parametric;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
        v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_logarithmic)
    {
        // Convert to parametric space, apply delta, convert back
        float v_new_parametric = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_cur, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        g.DragCurrentAccum -= (float)(v_new_parametric - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_decimal))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_decimal))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}